

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void kj::anon_unknown_0::setNonblocking(int fd)

{
  uint uVar1;
  int iVar2;
  Fault f;
  
  do {
    uVar1 = fcntl(fd,3);
    if (-1 < (int)uVar1) goto LAB_0020f1cd;
    iVar2 = _::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1ac,iVar2,"flags = fcntl(fd, F_GETFL)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_0020f1cd:
  if ((uVar1 >> 0xb & 1) == 0) {
    do {
      iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
      if (-1 < iVar2) {
        return;
      }
      iVar2 = _::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x1ae,iVar2,"fcntl(fd, F_SETFL, flags | O_NONBLOCK)","");
      _::Debug::Fault::fatal(&f);
    }
  }
  return;
}

Assistant:

static void setNonblocking(int fd) {
  int flags;
  KJ_SYSCALL(flags = fcntl(fd, F_GETFL));
  if ((flags & O_NONBLOCK) == 0) {
    KJ_SYSCALL(fcntl(fd, F_SETFL, flags | O_NONBLOCK));
  }
}